

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall punky::lex::Lexer::skip_whitespace(Lexer *this)

{
  bool bVar1;
  char ch;
  char *pcVar2;
  
  ch = this->m_curr_char;
  while( true ) {
    bVar1 = utils::is_whitespace(ch);
    if (!bVar1) break;
    pcVar2 = (this->m_curr_it)._M_current + 1;
    if (pcVar2 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) {
      ch = '\0';
    }
    else {
      (this->m_curr_it)._M_current = pcVar2;
      ch = *pcVar2;
    }
    this->m_curr_char = ch;
  }
  return;
}

Assistant:

void Lexer::skip_whitespace()
{
    while (utils::is_whitespace(m_curr_char))
        consume();
}